

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

void Abc_ZddPermTestInt(Abc_ZddMan *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int pComb [5];
  int pPerms [3] [5];
  
  pPerms[2][2] = 2;
  pPerms[2][3] = 1;
  pPerms[2][4] = 4;
  pPerms[1][3] = 0;
  pPerms[1][4] = 3;
  pPerms[2][0] = 0;
  pPerms[2][1] = 3;
  pPerms[0][4] = 3;
  pPerms[1][0] = 1;
  pPerms[1][1] = 2;
  pPerms[1][2] = 4;
  pPerms[0][0] = 1;
  pPerms[0][1] = 0;
  pPerms[0][2] = 2;
  pPerms[0][3] = 4;
  for (lVar7 = 0; lVar7 != 0x3c; lVar7 = lVar7 + 0x14) {
    Abc_ZddPermPrint((int *)((long)pPerms[0] + lVar7),5);
  }
  iVar3 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    printf("Perm %d:\n",uVar6 & 0xffffffff);
    Abc_ZddPermPrint(pPerms[uVar6],5);
    uVar1 = Abc_ZddPerm2Comb(pPerms[uVar6],5,pComb);
    Abc_ZddCombPrint(pComb,uVar1);
    uVar4 = uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = Abc_ZddVarIJ(p,pComb[uVar5] >> 0x10,pComb[uVar5] & 0xffff);
      pComb[uVar5] = iVar2;
    }
    Abc_ZddPermPrint(pComb,uVar1);
    iVar2 = Abc_ZddBuildSet(p,pComb,uVar1);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
  }
  puts("\nResulting set of permutations:");
  Abc_ZddPrint(p,iVar3);
  uVar4 = Abc_ZddCountNodes(p,iVar3);
  uVar1 = Abc_ZddCountPaths(p,iVar3);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar4,(ulong)uVar1);
  iVar3 = Abc_ZddPerm(p,iVar3,p->pT2V[(long)p->nPermSize * 3 + 4]);
  puts("\nResulting set of permutations:");
  Abc_ZddPrint(p,iVar3);
  uVar4 = Abc_ZddCountNodes(p,iVar3);
  uVar1 = Abc_ZddCountPaths(p,iVar3);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar4,(ulong)uVar1);
  putchar(10);
  return;
}

Assistant:

void Abc_ZddPermTestInt( Abc_ZddMan * p )
{
    int nPerms = 3;
    int Size = 5;
    int pPerms[3][5] = { {1, 0, 2, 4, 3}, {1, 2, 4, 0, 3}, {0, 3, 2, 1, 4} };
    int pComb[5], nTrans;
    int i, k, Set, Union = 0, iPivot;
    for ( i = 0; i < nPerms; i++ )
        Abc_ZddPermPrint( pPerms[i], Size );
    for ( i = 0; i < nPerms; i++ )
    {
        printf( "Perm %d:\n", i );
        Abc_ZddPermPrint( pPerms[i], Size );
        nTrans = Abc_ZddPerm2Comb( pPerms[i], Size, pComb );
        Abc_ZddCombPrint( pComb, nTrans );
        for ( k = 0; k < nTrans; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xFFFF );
        Abc_ZddPermPrint( pComb, nTrans );
        // add to ZDD
        Set = Abc_ZddBuildSet( p, pComb, nTrans );
        Union = Abc_ZddUnion( p, Union, Set );
    }
    printf( "\nResulting set of permutations:\n" );
    Abc_ZddPrint( p, Union );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );

    iPivot = Abc_ZddVarIJ( p, 3, 4 );
    Union = Abc_ZddPerm( p, Union, iPivot );

    printf( "\nResulting set of permutations:\n" );
    Abc_ZddPrint( p, Union );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );
    printf( "\n" );
}